

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_tracing_libapi.cpp
# Opt level: O0

ze_result_t zelTracerSetEnabled(zel_tracer_handle_t hTracer,ze_bool_t enable)

{
  zel_pfnTracerSetEnabled_t pfnSetEnabled;
  ze_bool_t enable_local;
  zel_tracer_handle_t hTracer_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    if (*(code **)(ze_lib::context + 0x48) == (code *)0x0) {
      hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    else {
      hTracer_local._4_4_ = (**(code **)(ze_lib::context + 0x48))(hTracer,enable);
    }
  }
  else {
    hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hTracer_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zelTracerSetEnabled(
    zel_tracer_handle_t hTracer,                ///< [in] handle of the tracer
    ze_bool_t enable                            ///< [in] enable the tracer if true; disable if false
    )
{
    if(ze_lib::destruction)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    auto pfnSetEnabled = ze_lib::context->zelTracingDdiTable.Tracer.pfnSetEnabled;
    if( nullptr == pfnSetEnabled )
        return ZE_RESULT_ERROR_UNINITIALIZED;

    return pfnSetEnabled( hTracer, enable );
}